

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint32_t fmix(uint32_t h)

{
  uint uVar1;
  uint32_t h_local;
  
  uVar1 = (h >> 0x10 ^ h) * -0x7a143595;
  uVar1 = (uVar1 >> 0xd ^ uVar1) * -0x3d4d51cb;
  return uVar1 >> 0x10 ^ uVar1;
}

Assistant:

static inline uint32_t fmix(uint32_t h) {
  h ^= h >> 16;
  h *= 0x85ebca6b;
  h ^= h >> 13;
  h *= 0xc2b2ae35;
  h ^= h >> 16;
  return h;
}